

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode getGroupId(char *groupString,uint *groupId)

{
  int iVar1;
  uint *in_RSI;
  char *in_RDI;
  uint i;
  uint local_1c;
  
  local_1c = 0;
  while( true ) {
    if (9 < local_1c) {
      return TA_GROUP_NOT_FOUND;
    }
    iVar1 = strcmp(TA_GroupString[local_1c],in_RDI);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  *in_RSI = local_1c;
  return TA_SUCCESS;
}

Assistant:

static TA_RetCode getGroupId( const char *groupString, unsigned int *groupId )
{
   unsigned int i;

   for( i=0; i < TA_NB_GROUP_ID; i++ )
   {
      if( strcmp( TA_GroupString[i], groupString ) == 0 )
      {
         *groupId = i;
         return TA_SUCCESS;
      }
   }

   return TA_GROUP_NOT_FOUND;
}